

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSDDOMParser::endAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,bool complete)

{
  XMLBuffer *this_00;
  DOMDocumentImpl *pDVar1;
  DOMNode *pDVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  undefined3 in_register_00000011;
  
  this_00 = &this->fAnnotationBuf;
  if (CONCAT31(in_register_00000011,complete) != 0) {
    XMLBuffer::append(this_00,L'\n');
    XMLBuffer::append(this_00,L'<');
    XMLBuffer::append(this_00,L'/');
    pXVar4 = XMLElementDecl::getFullName(elemDecl);
    XMLBuffer::append(this_00,pXVar4);
    XMLBuffer::append(this_00,L'>');
    pDVar1 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
    (this->fAnnotationBuf).fBuffer[(this->fAnnotationBuf).fIndex] = L'\0';
    iVar3 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3e])();
    pDVar2 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode;
    (*pDVar2->_vptr_DOMNode[0x11])(pDVar2,CONCAT44(extraout_var,iVar3));
    (this->fAnnotationBuf).fIndex = 0;
    return;
  }
  XMLBuffer::append(this_00,L'<');
  XMLBuffer::append(this_00,L'/');
  pXVar4 = XMLElementDecl::getFullName(elemDecl);
  XMLBuffer::append(this_00,pXVar4);
  XMLBuffer::append(this_00,L'>');
  return;
}

Assistant:

void XSDDOMParser::endAnnotationElement( const XMLElementDecl& elemDecl
                                       , bool complete)
{
    if (complete)
    {
        fAnnotationBuf.append(chLF);
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);

        // note that this is always called after endElement on <annotation>'s
        // child and before endElement on annotation.
        // hence, we must make this the child of the current
        // parent's only child.
        DOMTextImpl *node = (DOMTextImpl *)fDocument->createTextNode(fAnnotationBuf.getRawBuffer());
        fCurrentNode->appendChild(node);
        fAnnotationBuf.reset();
    }
    else      //capturing character calls
    {
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);
    }
}